

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void send_ssi_file(mg_connection *nc,char *path,FILE *fp,int include_level,mg_serve_http_opts *opts)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  bool bVar5;
  long local_2058;
  size_t i;
  int in_ssi_tag;
  int len;
  int offset;
  int ch;
  char *p;
  char buf [8192];
  mg_serve_http_opts *opts_local;
  int include_level_local;
  FILE *fp_local;
  char *path_local;
  mg_connection *nc_local;
  
  if (include_level < 0xb) {
    i._4_4_ = 0;
    bVar2 = false;
    while (iVar4 = fgetc((FILE *)fp), iVar4 != -1) {
      if ((((bVar2) && (iVar4 == 0x3e)) && (buf[(long)(i._4_4_ + -1) + -8] == '-')) &&
         (buf[(long)(i._4_4_ + -2) + -8] == '-')) {
        bVar2 = false;
        buf[(long)(i._4_4_ + -2) + -8] = '\0';
        lVar1 = (long)(i._4_4_ + -2);
        while( true ) {
          local_2058 = lVar1 + -1;
          bVar5 = false;
          if (local_2058 != 0) {
            bVar5 = *(char *)((long)&ch + lVar1 + 3) == ' ';
          }
          if (!bVar5) break;
          *(undefined1 *)((long)&ch + lVar1 + 3) = 0;
          lVar1 = local_2058;
        }
        iVar4 = memcmp((void *)((long)&p + 5),"include",7);
        if (iVar4 == 0) {
          do_ssi_include(nc,path,buf + 5,include_level,opts);
        }
        else if (stack0xffffffffffffdfcd == 0x6c6c6163) {
          do_ssi_call(nc,buf + 2);
        }
        else if (stack0xffffffffffffdfcd == 0x63657865) {
          do_ssi_exec(nc,buf + 2);
        }
        i._4_4_ = 0;
      }
      else {
        cVar3 = (char)iVar4;
        if (iVar4 == 0x3c) {
          bVar2 = true;
          if (0 < i._4_4_) {
            mg_send(nc,&p,i._4_4_);
          }
          i._4_4_ = 1;
          p._0_1_ = cVar3;
        }
        else if (bVar2) {
          if ((i._4_4_ == 5) && (iVar4 = memcmp(&p,"<!--#",5), iVar4 != 0)) {
            bVar2 = false;
          }
          else if (i._4_4_ == 0x1ffe) {
            mg_printf(nc,"%s: SSI tag is too large",path);
            i._4_4_ = 0;
          }
          buf[(long)i._4_4_ + -8] = cVar3;
          i._4_4_ = i._4_4_ + 1;
        }
        else {
          iVar4 = i._4_4_ + 1;
          buf[(long)i._4_4_ + -8] = cVar3;
          i._4_4_ = iVar4;
          if (iVar4 == 0x2000) {
            mg_send(nc,&p,0x2000);
            i._4_4_ = 0;
          }
        }
      }
    }
    if (0 < i._4_4_) {
      mg_send(nc,&p,i._4_4_);
    }
  }
  else {
    mg_printf(nc,"SSI #include level is too deep (%s)",path);
  }
  return;
}

Assistant:

static void send_ssi_file(struct mg_connection *nc, const char *path, FILE *fp,
                          int include_level,
                          const struct mg_serve_http_opts *opts) {
    static const struct mg_str btag = MG_STR("<!--#");
    static const struct mg_str d_include = MG_STR("include");
    static const struct mg_str d_call = MG_STR("call");
#ifndef MG_DISABLE_POPEN
    static const struct mg_str d_exec = MG_STR("exec");
#endif
    char buf[BUFSIZ], *p = buf + btag.len; /* p points to SSI directive */
    int ch, offset, len, in_ssi_tag;

    if (include_level > 10) {
        mg_printf(nc, "SSI #include level is too deep (%s)", path);
        return;
    }

    in_ssi_tag = len = offset = 0;
    while ((ch = fgetc(fp)) != EOF) {
        if (in_ssi_tag && ch == '>' && buf[len - 1] == '-' && buf[len - 2] == '-') {
            size_t i = len - 2;
            in_ssi_tag = 0;

            /* Trim closing --> */
            buf[i--] = '\0';
            while (i > 0 && buf[i] == ' ') {
                buf[i--] = '\0';
            }

            /* Handle known SSI directives */
            if (memcmp(p, d_include.p, d_include.len) == 0) {
                do_ssi_include(nc, path, p + d_include.len + 1, include_level, opts);
            } else if (memcmp(p, d_call.p, d_call.len) == 0) {
                do_ssi_call(nc, p + d_call.len + 1);
#ifndef MG_DISABLE_POPEN
            } else if (memcmp(p, d_exec.p, d_exec.len) == 0) {
                do_ssi_exec(nc, p + d_exec.len + 1);
#endif
            } else {
                /* Silently ignore unknown SSI directive. */
            }
            len = 0;
        } else if (ch == '<') {
            in_ssi_tag = 1;
            if (len > 0) {
                mg_send(nc, buf, (size_t) len);
            }
            len = 0;
            buf[len++] = ch & 0xff;
        } else if (in_ssi_tag) {
            if (len == (int) btag.len && memcmp(buf, btag.p, btag.len) != 0) {
                /* Not an SSI tag */
                in_ssi_tag = 0;
            } else if (len == (int) sizeof(buf) - 2) {
                mg_printf(nc, "%s: SSI tag is too large", path);
                len = 0;
            }
            buf[len++] = ch & 0xff;
        } else {
            buf[len++] = ch & 0xff;
            if (len == (int) sizeof(buf)) {
                mg_send(nc, buf, (size_t) len);
                len = 0;
            }
        }
    }

    /* Send the rest of buffered data */
    if (len > 0) {
        mg_send(nc, buf, (size_t) len);
    }
}